

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arguments.cc
# Opt level: O2

void __thiscall phosg::Arguments::assert_none_unused(Arguments *this)

{
  pointer pAVar1;
  long lVar2;
  _Hash_node_base *p_Var3;
  invalid_argument *piVar4;
  bool *pbVar5;
  long lVar6;
  __node_base *p_Var7;
  long lVar8;
  string local_40;
  
  pAVar1 = (this->positional).
           super__Vector_base<phosg::Arguments::ArgText,_std::allocator<phosg::Arguments::ArgText>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar2 = (long)(this->positional).
                super__Vector_base<phosg::Arguments::ArgText,_std::allocator<phosg::Arguments::ArgText>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar1;
  lVar6 = lVar2 % 0x28;
  pbVar5 = &pAVar1->used;
  lVar8 = 0;
  while( true ) {
    if (lVar2 / 0x28 == lVar8) {
      p_Var7 = &(this->named)._M_h._M_before_begin;
      do {
        p_Var7 = p_Var7->_M_nxt;
        if (p_Var7 == (__node_base *)0x0) {
          return;
        }
        lVar2 = 0;
        for (p_Var3 = p_Var7[5]._M_nxt; p_Var3 != p_Var7[6]._M_nxt; p_Var3 = p_Var3 + 5) {
          if (*(char *)&p_Var3[4]._M_nxt == '\0') {
            piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10,0x28,lVar6);
            string_printf_abi_cxx11_(&local_40,"(--%s#%zu) excess argument",p_Var7[1]._M_nxt,lVar2);
            ::std::invalid_argument::invalid_argument(piVar4,(string *)&local_40);
            __cxa_throw(piVar4,&::std::invalid_argument::typeinfo,
                        ::std::invalid_argument::~invalid_argument);
          }
          lVar2 = lVar2 + 1;
        }
      } while( true );
    }
    if (*pbVar5 == false) break;
    lVar8 = lVar8 + 1;
    pbVar5 = pbVar5 + 0x28;
  }
  piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10,0x28,lVar6);
  string_printf_abi_cxx11_(&local_40,"(@%zu) excess argument",lVar8);
  ::std::invalid_argument::invalid_argument(piVar4,(string *)&local_40);
  __cxa_throw(piVar4,&::std::invalid_argument::typeinfo,::std::invalid_argument::~invalid_argument);
}

Assistant:

void Arguments::assert_none_unused() const {
  for (size_t z = 0; z < this->positional.size(); z++) {
    const auto& arg = this->positional[z];
    if (!arg.used) {
      throw invalid_argument(string_printf("(@%zu) excess argument", z));
    }
  }
  for (const auto& named_it : this->named) {
    size_t index = 0;
    for (const auto& instance_it : named_it.second) {
      if (!instance_it.used) {
        throw invalid_argument(string_printf("(--%s#%zu) excess argument", named_it.first.c_str(), index));
      }
      index++;
    }
  }
}